

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembleList<long_double>::TPZDohrAssembleList
          (TPZDohrAssembleList<long_double> *this,int numitems,TPZFMatrix<long_double> *output,
          TPZAutoPointer<TPZDohrAssembly<long_double>_> *assembly)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  TPZAutoPointer<TPZDohrAssembly<long_double>_> *in_stack_ffffffffffffff98;
  TPZSemaphore *this_00;
  
  *in_RDI = in_ESI;
  this_00 = (TPZSemaphore *)(in_RDI + 2);
  TPZSemaphore::TPZSemaphore(this_00);
  *(undefined8 *)(in_RDI + 0x1e) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x1a) = 0;
  *(undefined8 *)(in_RDI + 0x1c) = 0;
  *(undefined8 *)(in_RDI + 0x22) = 0;
  std::mutex::mutex((mutex *)0x1fc8ac6);
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x2a) = 0;
  *(undefined8 *)(in_RDI + 0x24) = 0;
  *(undefined8 *)(in_RDI + 0x26) = 0;
  *(undefined8 *)(in_RDI + 0x2c) = 0;
  std::mutex::mutex((mutex *)0x1fc8af8);
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
  ::list((list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
          *)0x1fc8b0e);
  TPZAutoPointer<TPZDohrAssembly<long_double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)this_00,in_stack_ffffffffffffff98);
  *(undefined8 *)(in_RDI + 0x36) = in_RDX;
  return;
}

Assistant:

TPZDohrAssembleList<TVar>::TPZDohrAssembleList(int numitems, TPZFMatrix<TVar> &output, TPZAutoPointer<TPZDohrAssembly<TVar> > assembly) : fNumItems(numitems),
fAssembleIndexes(assembly), fOutput(&output), fAssemblyLock(), fListAccessLock()
{
}